

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::treeFind
          (const_iterator *this,unsigned_long left,unsigned_long right)

{
  pointer pEVar1;
  uint uVar2;
  interval<unsigned_long> *piVar3;
  ulong *puVar4;
  int iVar5;
  uint32_t offset;
  ulong uVar6;
  long lVar7;
  BranchNode<unsigned_long,_8U,_false> *self;
  int iVar8;
  ulong uVar9;
  uint local_3c;
  NodeRef local_38;
  
  uVar2 = this->map->rootSize;
  uVar6 = 0;
  if ((ulong)uVar2 != 0) {
    piVar3 = (this->map->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
             .first + 4;
    uVar6 = 0;
    do {
      if (left <= piVar3->left) goto LAB_0038f4dc;
      uVar6 = uVar6 + 1;
      piVar3 = piVar3 + 1;
    } while (uVar2 != uVar6);
    uVar6 = (ulong)uVar2;
  }
LAB_0038f4dc:
  offset = (int)uVar6 - 1;
  if ((int)uVar6 == 0) {
    offset = 0;
  }
  setRoot(this,offset);
  if (((this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0) &&
     (pEVar1 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
     , pEVar1->offset < pEVar1->size)) {
    iVar5 = (int)(this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len
    ;
    uVar2 = iVar5 - 1;
    pEVar1 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    local_38.pip.value =
         *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
          ((long)pEVar1[uVar2].node + (ulong)pEVar1[uVar2].offset * 8);
    iVar5 = this->map->height - iVar5;
    if (iVar5 != 0) {
      do {
        uVar6 = (ulong)local_38.pip.value & 0xffffffffffffffc0;
        uVar2 = SUB84(local_38.pip.value,0) & 0x3f;
        iVar8 = uVar2 + 1;
        puVar4 = (ulong *)(uVar6 + 0x40);
        lVar7 = 0;
        do {
          if (left <= *puVar4) {
            iVar8 = (int)lVar7;
            break;
          }
          lVar7 = lVar7 + 1;
          puVar4 = puVar4 + 2;
        } while ((ulong)uVar2 + 1 != lVar7);
        local_3c = iVar8 - 1;
        if (iVar8 == 0) {
          local_3c = 0;
        }
        uVar9 = (ulong)local_3c;
        SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
        emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                  ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,&local_38,
                   &local_3c);
        local_38.pip.value = *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)(uVar6 + uVar9 * 8);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    puVar4 = (ulong *)((ulong)local_38.pip.value & 0xffffffffffffffc0);
    uVar2 = SUB84(local_38.pip.value,0) & 0x3f;
    local_3c = uVar2 + 1;
    lVar7 = 0;
    do {
      if (left <= *puVar4) {
        local_3c = (uint)lVar7;
        break;
      }
      lVar7 = lVar7 + 1;
      puVar4 = puVar4 + 2;
    } while ((ulong)uVar2 + 1 != lVar7);
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
    emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
              ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,&local_38,
               &local_3c);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::const_iterator::treeFind(TKey left, TKey right) {
    using namespace IntervalMapDetails;
    SLANG_ASSERT(!isFlat());

    interval<TKey> ival{left, right};
    uint32_t offset = map->rootBranch.find(map->rootSize, ival);
    if (offset)
        offset--;
    setRoot(offset);

    if (valid()) {
        auto child = path.childAt(path.height());
        for (uint32_t i = map->height - path.height() - 1; i > 0; i--) {
            offset = child.template get<Branch>().find(child.size(), ival);
            if (offset)
                offset--;
            path.push(child, offset);
            child = child.childAt(offset);
        }

        path.push(child, child.template get<Leaf>().find(child.size(), ival));
    }
}